

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_x86.cpp
# Opt level: O1

void __thiscall ncnn::Deconvolution_x86::Deconvolution_x86(Deconvolution_x86 *this)

{
  Deconvolution::Deconvolution(&this->super_Deconvolution);
  (this->super_Deconvolution).super_Layer._vptr_Layer =
       (_func_int **)&PTR__Deconvolution_x86_006507e8;
  (this->weight_data_tm).cstep = 0;
  (this->weight_data_tm).data = (void *)0x0;
  (this->weight_data_tm).refcount = (int *)0x0;
  *(undefined8 *)((long)&(this->weight_data_tm).refcount + 4) = 0;
  *(undefined8 *)((long)&(this->weight_data_tm).elemsize + 4) = 0;
  (this->weight_data_tm).allocator = (Allocator *)0x0;
  (this->weight_data_tm).dims = 0;
  (this->weight_data_tm).w = 0;
  (this->weight_data_tm).w = 0;
  (this->weight_data_tm).h = 0;
  (this->weight_data_tm).d = 0;
  (this->weight_data_tm).c = 0;
  (this->super_Deconvolution).super_Layer.support_packing = true;
  this->activation = (Layer *)0x0;
  this->gemm = (Layer *)0x0;
  return;
}

Assistant:

Deconvolution_x86::Deconvolution_x86()
{
#if __SSE2__
    support_packing = true;
#endif // __SSE2__

    activation = 0;
    gemm = 0;
}